

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O3

int wally_psbt_from_bytes(uchar *bytes,size_t len,wally_psbt **output)

{
  int iVar1;
  bool bVar2;
  wally_map *output_00;
  wally_psbt_output *pwVar3;
  wally_psbt_output *pwVar4;
  wally_psbt_output *pwVar5;
  wally_psbt_output *pwVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  int *piVar9;
  uint64_t uVar10;
  size_t sVar11;
  uint64_t uVar12;
  uchar *puVar13;
  wally_map_item *pwVar14;
  wally_psbt_output *pwVar15;
  wally_tx *pwVar16;
  wally_psbt_output *pwVar17;
  wally_psbt_output *pwVar18;
  wally_psbt_output *pwVar19;
  wally_psbt_input *pwVar20;
  undefined4 uVar21;
  _func_int_uchar_ptr_size_t *in_R9;
  wally_psbt_output *pwVar22;
  uchar *val;
  uchar *key;
  size_t val_max;
  wally_tx *tx;
  wally_psbt *result;
  size_t value_len;
  size_t asset_len;
  uchar *nonce;
  uchar *value;
  uchar *asset;
  size_t in_stack_fffffffffffffe40;
  long *local_188;
  uchar *local_180;
  uchar *local_178;
  uchar *local_170;
  wally_tx *local_168;
  wally_psbt *local_160;
  undefined8 local_158;
  wally_psbt_input *local_150;
  wally_psbt_output *local_148;
  wally_psbt_output *local_140;
  size_t local_138;
  wally_psbt_output *local_130;
  wally_psbt_output *local_128;
  wally_psbt_output *local_120;
  wally_psbt_output *local_118;
  wally_psbt_output *local_110;
  wally_psbt_output *local_108;
  wally_psbt_output *local_100;
  wally_psbt_output *local_f8;
  wally_psbt_output *local_f0;
  wally_psbt_output *local_e8;
  wally_psbt_output *local_e0;
  wally_psbt_output *local_d8;
  wally_psbt_output *local_d0;
  wally_psbt_output *local_c8;
  wally_psbt_output *local_c0;
  size_t local_b8;
  wally_psbt_output *local_b0;
  wally_psbt_output *local_a8;
  wally_psbt_output *local_a0;
  wally_psbt_output *local_98;
  wally_psbt_output *local_90;
  wally_psbt_output *local_88;
  wally_psbt_output *local_80;
  wally_psbt_output *local_78;
  wally_psbt_input *local_70;
  wally_psbt **local_68;
  size_t local_60;
  _func_int_uchar_ptr_size_t *local_58;
  size_t local_50;
  uchar *local_48;
  uchar *local_40;
  uchar *local_38;
  
  local_160 = (wally_psbt *)0x0;
  if (output == (wally_psbt **)0x0) {
    return -2;
  }
  *output = (wally_psbt *)0x0;
  local_178 = bytes;
  local_138 = len;
  piVar9 = (int *)pull_skip(&local_178,&local_138,5);
  if (piVar9 != (int *)0x0) {
    iVar1 = *piVar9;
    bVar2 = (char)piVar9[1] == -1;
    if (bVar2 && iVar1 == 0x74627370) {
      uVar21 = 0;
      local_158 = (wally_map *)CONCAT44(local_158._4_4_,8);
    }
    else {
      if ((char)piVar9[1] != -1 || *piVar9 != 0x74657370) goto LAB_0016ed46;
      local_158 = (wally_map *)((ulong)local_158._4_4_ << 0x20);
      uVar21 = 2;
    }
    uVar7 = wally_psbt_init_alloc(0,0,0,8,&local_160);
    puVar13 = local_178;
    if (uVar7 != 0) goto LAB_0016ed8b;
    local_150 = (wally_psbt_input *)CONCAT71(local_150._1_7_,!bVar2 || iVar1 != 0x74627370);
    local_140 = (wally_psbt_output *)CONCAT44(local_140._4_4_,uVar21);
    local_160->magic[4] = (uchar)piVar9[1];
    *(int *)local_160->magic = *piVar9;
    local_68 = output;
    local_b8 = pull_varlength(&local_178,&local_138);
    if (local_b8 != 0) {
      local_158 = (wally_map *)CONCAT44(local_158._4_4_,(uint)local_158 | (uint)local_140);
      do {
        pull_subfield_start(&local_178,&local_138,local_b8,&local_180,&local_b8);
        uVar10 = pull_varint(&local_180,&local_b8);
        if (uVar10 == 0xfb) {
          uVar7 = 0xfffffffe;
          if (local_160->version != 0) goto LAB_0016ed8b;
          subfield_nomore_end(&local_178,&local_138,local_180,local_b8);
          uVar10 = pull_varint(&local_178,&local_138);
          pull_subfield_start(&local_178,&local_138,uVar10,(uchar **)&local_188,(size_t *)&local_170
                             );
          uVar7 = 0xfffffffe;
          uVar8 = pull_le32((uchar **)&local_188,(size_t *)&local_170);
          local_160->version = uVar8;
          subfield_nomore_end(&local_178,&local_138,(uchar *)local_188,(size_t)local_170);
          uVar8 = local_160->version;
joined_r0x0016ef7d:
          if (uVar8 != 0) goto LAB_0016ed8b;
        }
        else {
          if (uVar10 != 0) {
            uVar7 = pull_unknown_key_value(&local_178,&local_138,puVar13,&local_160->unknowns);
            uVar8 = uVar7;
            goto joined_r0x0016ef7d;
          }
          subfield_nomore_end(&local_178,&local_138,local_180,local_b8);
          uVar10 = pull_varint(&local_178,&local_138);
          pull_subfield_start(&local_178,&local_138,uVar10,(uchar **)&local_188,(size_t *)&local_170
                             );
          uVar7 = wally_tx_from_bytes((uchar *)local_188,(size_t)local_170,(uint)local_158,
                                      &local_168);
          if (uVar7 != 0) goto LAB_0016ed8b;
          uVar7 = psbt_set_global_tx(local_160,local_168,false);
          if (uVar7 != 0) {
            wally_tx_free(local_168);
            goto LAB_0016ed8b;
          }
          pull_subfield_end(&local_178,&local_138,(uchar *)local_188,(size_t)local_170);
        }
        puVar13 = local_178;
        local_b8 = pull_varlength(&local_178,&local_138);
      } while (local_b8 != 0);
    }
    if ((local_178 != (uchar *)0x0) && (pwVar16 = local_160->tx, pwVar16 != (wally_tx *)0x0)) {
      if (pwVar16->num_inputs != 0) {
        pwVar15 = (wally_psbt_output *)0x0;
        local_e0 = (wally_psbt_output *)CONCAT44(local_e0._4_4_,(uint)(byte)local_150);
LAB_0016f012:
        puVar13 = local_178;
        local_150 = local_160->inputs + (long)pwVar15;
        local_c8 = pwVar15;
        local_180 = (uchar *)pull_varlength(&local_178,&local_138);
        if (local_180 == (uchar *)0x0) goto LAB_0016fc60;
        local_108 = (wally_psbt_output *)&local_150->claim_script;
        local_78 = (wally_psbt_output *)&local_150->claim_script_len;
        local_118 = (wally_psbt_output *)&local_150->genesis_blockhash;
        local_88 = (wally_psbt_output *)&local_150->genesis_blockhash_len;
        local_110 = (wally_psbt_output *)&local_150->txoutproof;
        local_80 = (wally_psbt_output *)&local_150->txoutproof_len;
        local_70 = (wally_psbt_input *)&local_150->pegin_tx;
        local_120 = (wally_psbt_output *)&local_150->abf;
        local_90 = (wally_psbt_output *)&local_150->abf_len;
        local_128 = (wally_psbt_output *)&local_150->asset;
        local_98 = (wally_psbt_output *)&local_150->asset_len;
        local_130 = (wally_psbt_output *)&local_150->vbf;
        local_a0 = (wally_psbt_output *)&local_150->vbf_len;
        local_158 = (wally_map *)&local_150->final_witness;
        local_f0 = (wally_psbt_output *)&local_150->final_scriptsig;
        local_e8 = (wally_psbt_output *)&local_150->final_scriptsig_len;
        local_d0 = (wally_psbt_output *)&local_150->keypaths;
        local_f8 = (wally_psbt_output *)&local_150->witness_script;
        local_a8 = (wally_psbt_output *)&local_150->witness_script_len;
        local_100 = (wally_psbt_output *)&local_150->redeem_script;
        local_b0 = (wally_psbt_output *)&local_150->redeem_script_len;
        local_d8 = (wally_psbt_output *)&local_150->signatures;
        local_148 = (wally_psbt_output *)&local_150->witness_utxo;
        local_c0 = (wally_psbt_output *)&local_150->unknowns;
LAB_0016f191:
        pull_subfield_start(&local_178,&local_138,(size_t)local_180,(uchar **)&local_188,
                            (size_t *)&local_180);
        uVar10 = pull_varint((uchar **)&local_188,(size_t *)&local_180);
        pwVar20 = local_150;
        output_00 = local_158;
        switch(uVar10) {
        case 0:
LAB_0016f1d2:
          if (pwVar20->utxo != (wally_tx *)0x0) goto LAB_0016ed46;
          subfield_nomore_end(&local_178,&local_138,(uchar *)local_188,(size_t)local_180);
          uVar10 = pull_varint(&local_178,&local_138);
          pull_subfield_start(&local_178,&local_138,uVar10,&local_170,(size_t *)&local_168);
          uVar7 = wally_tx_from_bytes(local_170,(size_t)local_168,(uint)local_140,&pwVar20->utxo);
          if (uVar7 != 0) goto LAB_0016ed8b;
          pull_subfield_end(&local_178,&local_138,local_170,(size_t)local_168);
          break;
        case 1:
          uVar7 = 0xfffffffe;
          if ((wally_map_item *)local_148->redeem_script == (wally_map_item *)0x0) {
            subfield_nomore_end(&local_178,&local_138,(uchar *)local_188,(size_t)local_180);
            uVar10 = pull_varint(&local_178,&local_138);
            pull_subfield_start(&local_178,&local_138,uVar10,&local_170,(size_t *)&local_168);
            if ((int)local_e0 == 0) {
              uVar10 = pull_le64(&local_170,(size_t *)&local_168);
              uVar12 = pull_varint(&local_170,(size_t *)&local_168);
              puVar13 = pull_skip(&local_170,(size_t *)&local_168,uVar12);
              if ((uVar12 == 0) || (puVar13 == (uchar *)0x0)) goto LAB_0016ed8b;
              uVar7 = wally_tx_output_init_alloc
                                (uVar10,puVar13,uVar12,(wally_tx_output **)local_148);
            }
            else {
              uVar7 = pull_elements_confidential
                                (&local_170,(size_t *)&local_168,&local_38,&local_50,10,0xb,0x21,
                                 in_stack_fffffffffffffe40);
              if (((uVar7 != 0) ||
                  (uVar7 = pull_elements_confidential
                                     (&local_170,(size_t *)&local_168,&local_40,(size_t *)&local_58,
                                      8,9,9,in_stack_fffffffffffffe40), uVar7 != 0)) ||
                 (uVar7 = pull_elements_confidential
                                    (&local_170,(size_t *)&local_168,&local_48,&local_60,2,3,0x21,
                                     in_stack_fffffffffffffe40), uVar7 != 0)) goto LAB_0016ed8b;
              uVar10 = pull_varint(&local_170,(size_t *)&local_168);
              puVar13 = pull_skip(&local_170,(size_t *)&local_168,uVar10);
              uVar7 = 0xfffffffe;
              if ((uVar10 == 0) || (puVar13 == (uchar *)0x0)) goto LAB_0016ed8b;
              in_R9 = local_58;
              in_stack_fffffffffffffe40 = local_60;
              uVar7 = wally_tx_elements_output_init_alloc
                                (puVar13,uVar10,local_38,local_50,local_40,(size_t)local_58,local_48
                                 ,local_60,(uchar *)0x0,0,(uchar *)0x0,0,
                                 (wally_tx_output **)local_148);
            }
            if (uVar7 == 0) goto LAB_0016f7ce;
          }
          goto LAB_0016ed8b;
        case 2:
          pwVar15 = local_d8;
          goto LAB_0016f632;
        case 3:
          if (local_150->sighash != 0) goto LAB_0016ed46;
          subfield_nomore_end(&local_178,&local_138,(uchar *)local_188,(size_t)local_180);
          uVar10 = pull_varint(&local_178,&local_138);
          pull_subfield_start(&local_178,&local_138,uVar10,&local_170,(size_t *)&local_168);
          uVar7 = pull_le32(&local_170,(size_t *)&local_168);
          pwVar20->sighash = uVar7;
LAB_0016f7ce:
          subfield_nomore_end(&local_178,&local_138,local_170,(size_t)local_168);
          break;
        case 4:
          if ((wally_map_item *)local_100->redeem_script != (wally_map_item *)0x0)
          goto LAB_0016ed46;
          subfield_nomore_end(&local_178,&local_138,(uchar *)local_188,(size_t)local_180);
          sVar11 = pull_varlength(&local_178,&local_138);
          puVar13 = pull_skip(&local_178,&local_138,sVar11);
          pwVar15 = local_b0;
          pwVar18 = local_100;
          if (sVar11 != 0) goto LAB_0016f603;
          pwVar14 = (wally_map_item *)wally_malloc(1);
          pwVar15 = local_100;
LAB_0016f7ed:
          pwVar15->redeem_script = (uchar *)pwVar14;
          break;
        case 5:
          if ((wally_map_item *)local_f8->redeem_script == (wally_map_item *)0x0) {
            subfield_nomore_end(&local_178,&local_138,(uchar *)local_188,(size_t)local_180);
            sVar11 = pull_varlength(&local_178,&local_138);
            puVar13 = pull_skip(&local_178,&local_138,sVar11);
            pwVar15 = local_a8;
            pwVar18 = local_f8;
            if (sVar11 == 0) {
              pwVar14 = (wally_map_item *)wally_malloc(1);
              pwVar15 = local_f8;
              goto LAB_0016f7ed;
            }
            goto LAB_0016f603;
          }
          goto LAB_0016ed46;
        case 6:
          pwVar15 = local_d0;
LAB_0016f632:
          uVar7 = pull_map(&local_178,&local_138,(uchar *)local_188,(size_t)local_180,
                           (wally_map *)pwVar15,in_R9);
joined_r0x0016f60f:
          if (uVar7 != 0) goto LAB_0016ed8b;
          break;
        case 7:
          if ((wally_map_item *)local_f0->redeem_script != (wally_map_item *)0x0) goto LAB_0016ed46;
          subfield_nomore_end(&local_178,&local_138,(uchar *)local_188,(size_t)local_180);
          sVar11 = pull_varlength(&local_178,&local_138);
          puVar13 = pull_skip(&local_178,&local_138,sVar11);
          pwVar15 = local_e8;
          pwVar18 = local_f0;
          if (sVar11 == 0) {
            pwVar14 = (wally_map_item *)wally_malloc(1);
            pwVar15 = local_f0;
            goto LAB_0016f7ed;
          }
          goto LAB_0016f603;
        case 8:
          if (local_158->items != (wally_map_item *)0x0) goto LAB_0016ed46;
          subfield_nomore_end(&local_178,&local_138,(uchar *)local_188,(size_t)local_180);
          uVar10 = pull_varint(&local_178,&local_138);
          pull_subfield_start(&local_178,&local_138,uVar10,&local_170,(size_t *)&local_168);
          uVar10 = pull_varint(&local_170,(size_t *)&local_168);
          uVar7 = wally_tx_witness_stack_init_alloc(uVar10,(wally_tx_witness_stack **)output_00);
          if (uVar7 != 0) goto LAB_0016ed8b;
          if (uVar10 != 0) {
            sVar11 = 0;
            do {
              uVar12 = pull_varint(&local_170,(size_t *)&local_168);
              pwVar14 = local_158->items;
              puVar13 = pull_skip(&local_170,(size_t *)&local_168,uVar12);
              uVar7 = wally_tx_witness_stack_set
                                ((wally_tx_witness_stack *)pwVar14,sVar11,puVar13,uVar12);
              if (uVar7 != 0) goto LAB_0016ed8b;
              sVar11 = sVar11 + 1;
            } while (uVar10 != sVar11);
          }
          subfield_nomore_end(&local_178,&local_138,local_170,(size_t)local_168);
          break;
        default:
          if (((uVar10 != 0xfc) ||
              (sVar11 = pull_varlength((uchar **)&local_188,(size_t *)&local_180), sVar11 != 8)) ||
             (*local_188 != 0x73746e656d656c65)) {
switchD_0016f855_default:
            uVar7 = pull_unknown_key_value(&local_178,&local_138,puVar13,(wally_map *)local_c0);
            goto joined_r0x0016f60f;
          }
          pull_skip((uchar **)&local_188,(size_t *)&local_180,8);
          uVar10 = pull_varint((uchar **)&local_188,(size_t *)&local_180);
          pwVar20 = local_150;
          switch(uVar10) {
          case 0:
            if (local_150->has_value == 0) {
              subfield_nomore_end(&local_178,&local_138,(uchar *)local_188,(size_t)local_180);
              uVar10 = pull_varint(&local_178,&local_138);
              pull_subfield_start(&local_178,&local_138,uVar10,&local_170,(size_t *)&local_168);
              uVar10 = pull_le64(&local_170,(size_t *)&local_168);
              pwVar20->value = uVar10;
              subfield_nomore_end(&local_178,&local_138,local_170,(size_t)local_168);
              pwVar20->has_value = 1;
              goto LAB_0016f7f5;
            }
            goto LAB_0016ed46;
          case 1:
            uVar7 = 0xfffffffe;
            if ((wally_map_item *)local_130->redeem_script == (wally_map_item *)0x0) {
              subfield_nomore_end(&local_178,&local_138,(uchar *)local_188,(size_t)local_180);
              sVar11 = pull_varlength(&local_178,&local_138);
              puVar13 = pull_skip(&local_178,&local_138,sVar11);
              if (sVar11 == 0) {
                pwVar14 = (wally_map_item *)wally_malloc(1);
                pwVar15 = local_130;
                goto LAB_0016f7ed;
              }
              pwVar15 = local_a0;
              pwVar18 = local_130;
              if ((sVar11 != 0x20) != (puVar13 != (uchar *)0x0)) break;
            }
            goto LAB_0016ed8b;
          case 2:
            uVar7 = 0xfffffffe;
            if ((wally_map_item *)local_128->redeem_script != (wally_map_item *)0x0)
            goto LAB_0016ed8b;
            subfield_nomore_end(&local_178,&local_138,(uchar *)local_188,(size_t)local_180);
            sVar11 = pull_varlength(&local_178,&local_138);
            puVar13 = pull_skip(&local_178,&local_138,sVar11);
            if (sVar11 == 0) {
              pwVar14 = (wally_map_item *)wally_malloc(1);
              pwVar15 = local_128;
              goto LAB_0016f7ed;
            }
            pwVar15 = local_98;
            pwVar18 = local_128;
            if ((sVar11 != 0x20) == (puVar13 != (uchar *)0x0)) goto LAB_0016ed8b;
            break;
          case 3:
            uVar7 = 0xfffffffe;
            if ((wally_map_item *)local_120->redeem_script != (wally_map_item *)0x0)
            goto LAB_0016ed8b;
            subfield_nomore_end(&local_178,&local_138,(uchar *)local_188,(size_t)local_180);
            sVar11 = pull_varlength(&local_178,&local_138);
            puVar13 = pull_skip(&local_178,&local_138,sVar11);
            if (sVar11 == 0) {
              pwVar14 = (wally_map_item *)wally_malloc(1);
              pwVar15 = local_120;
              goto LAB_0016f7ed;
            }
            pwVar15 = local_90;
            pwVar18 = local_120;
            if ((sVar11 != 0x20) == (puVar13 != (uchar *)0x0)) goto LAB_0016ed8b;
            break;
          case 4:
            pwVar20 = local_70;
            goto LAB_0016f1d2;
          case 5:
            if ((wally_map_item *)local_110->redeem_script != (wally_map_item *)0x0)
            goto LAB_0016ed46;
            subfield_nomore_end(&local_178,&local_138,(uchar *)local_188,(size_t)local_180);
            sVar11 = pull_varlength(&local_178,&local_138);
            puVar13 = pull_skip(&local_178,&local_138,sVar11);
            pwVar15 = local_80;
            pwVar18 = local_110;
            if (sVar11 == 0) {
              pwVar14 = (wally_map_item *)wally_malloc(1);
              pwVar15 = local_110;
              goto LAB_0016f7ed;
            }
            break;
          case 6:
            uVar7 = 0xfffffffe;
            if ((wally_map_item *)local_118->redeem_script != (wally_map_item *)0x0)
            goto LAB_0016ed8b;
            subfield_nomore_end(&local_178,&local_138,(uchar *)local_188,(size_t)local_180);
            sVar11 = pull_varlength(&local_178,&local_138);
            puVar13 = pull_skip(&local_178,&local_138,sVar11);
            if (sVar11 == 0) {
              pwVar14 = (wally_map_item *)wally_malloc(1);
              pwVar15 = local_118;
              goto LAB_0016f7ed;
            }
            pwVar15 = local_88;
            pwVar18 = local_118;
            if ((sVar11 != 0x20) == (puVar13 != (uchar *)0x0)) goto LAB_0016ed8b;
            break;
          case 7:
            if ((wally_map_item *)local_108->redeem_script != (wally_map_item *)0x0)
            goto LAB_0016ed46;
            subfield_nomore_end(&local_178,&local_138,(uchar *)local_188,(size_t)local_180);
            sVar11 = pull_varlength(&local_178,&local_138);
            puVar13 = pull_skip(&local_178,&local_138,sVar11);
            pwVar15 = local_78;
            pwVar18 = local_108;
            if (sVar11 == 0) {
              pwVar14 = (wally_map_item *)wally_malloc(1);
              pwVar15 = local_108;
              goto LAB_0016f7ed;
            }
            break;
          default:
            goto switchD_0016f855_default;
          }
LAB_0016f603:
          uVar7 = replace_bytes(puVar13,sVar11,&pwVar18->redeem_script,(size_t *)pwVar15);
          goto joined_r0x0016f60f;
        }
LAB_0016f7f5:
        puVar13 = local_178;
        local_180 = (uchar *)pull_varlength(&local_178,&local_138);
        if (local_180 == (uchar *)0x0) goto LAB_0016fc60;
        goto LAB_0016f191;
      }
LAB_0016fc7e:
      if (pwVar16->num_outputs != 0) {
        pwVar15 = (wally_psbt_output *)0x0;
        do {
          puVar13 = local_178;
          pwVar18 = local_160->outputs + (long)pwVar15;
          local_100 = pwVar15;
          local_180 = (uchar *)pull_varlength(&local_178,&local_138);
          if (local_180 != (uchar *)0x0) {
            local_c8 = (wally_psbt_output *)&pwVar18->nonce;
            local_110 = (wally_psbt_output *)&pwVar18->nonce_len;
            local_a8 = (wally_psbt_output *)&pwVar18->blinding_pubkey;
            local_148 = (wally_psbt_output *)&pwVar18->surjectionproof;
            local_b0 = (wally_psbt_output *)&pwVar18->surjectionproof_len;
            local_c0 = (wally_psbt_output *)&pwVar18->rangeproof;
            local_108 = (wally_psbt_output *)&pwVar18->rangeproof_len;
            local_d0 = (wally_psbt_output *)&pwVar18->abf;
            local_118 = (wally_psbt_output *)&pwVar18->abf_len;
            local_d8 = (wally_psbt_output *)&pwVar18->asset_commitment;
            local_120 = (wally_psbt_output *)&pwVar18->asset_commitment_len;
            local_e0 = (wally_psbt_output *)&pwVar18->vbf;
            local_128 = (wally_psbt_output *)&pwVar18->vbf_len;
            local_e8 = (wally_psbt_output *)&pwVar18->value_commitment;
            local_130 = (wally_psbt_output *)&pwVar18->value_commitment_len;
            local_150 = (wally_psbt_input *)&pwVar18->keypaths;
            local_140 = (wally_psbt_output *)&pwVar18->witness_script;
            local_f0 = (wally_psbt_output *)&pwVar18->witness_script_len;
            local_f8 = (wally_psbt_output *)&pwVar18->redeem_script_len;
            local_158 = &pwVar18->unknowns;
LAB_0016fdd6:
            pull_subfield_start(&local_178,&local_138,(size_t)local_180,(uchar **)&local_188,
                                (size_t *)&local_180);
            uVar10 = pull_varint((uchar **)&local_188,(size_t *)&local_180);
            pwVar15 = local_140;
            if ((long)uVar10 < 2) {
              if (uVar10 == 0) {
                if (pwVar18->redeem_script == (uchar *)0x0) {
                  subfield_nomore_end(&local_178,&local_138,(uchar *)local_188,(size_t)local_180);
                  sVar11 = pull_varlength(&local_178,&local_138);
                  puVar13 = pull_skip(&local_178,&local_138,sVar11);
                  pwVar15 = pwVar18;
                  pwVar19 = pwVar18;
                  pwVar17 = local_f8;
                  goto joined_r0x0016ff12;
                }
                goto LAB_0016ed46;
              }
              if (uVar10 != 1) goto switchD_0016ff9f_default;
              if ((wally_map_item *)local_140->redeem_script != (wally_map_item *)0x0)
              goto LAB_0016ed46;
              subfield_nomore_end(&local_178,&local_138,(uchar *)local_188,(size_t)local_180);
              sVar11 = pull_varlength(&local_178,&local_138);
              puVar13 = pull_skip(&local_178,&local_138,sVar11);
              pwVar19 = local_140;
              pwVar17 = local_f0;
joined_r0x0016ff12:
              pwVar22 = pwVar15;
              if (sVar11 == 0) goto LAB_00170358;
LAB_0016ff29:
              uVar7 = replace_bytes(puVar13,sVar11,&pwVar19->redeem_script,(size_t *)pwVar17);
joined_r0x0016ff5c:
              if (uVar7 == 0) goto LAB_0017036b;
              goto LAB_0016ed8b;
            }
            if (uVar10 == 2) {
              uVar7 = pull_map(&local_178,&local_138,(uchar *)local_188,(size_t)local_180,
                               (wally_map *)local_150,in_R9);
              goto joined_r0x0016ff5c;
            }
            if (((uVar10 != 0xfc) ||
                (sVar11 = pull_varlength((uchar **)&local_188,(size_t *)&local_180), sVar11 != 8))
               || (*local_188 != 0x73746e656d656c65)) {
switchD_0016ff9f_default:
              uVar7 = pull_unknown_key_value(&local_178,&local_138,puVar13,local_158);
              goto joined_r0x0016ff5c;
            }
            pull_skip((uchar **)&local_188,(size_t *)&local_180,8);
            uVar10 = pull_varint((uchar **)&local_188,(size_t *)&local_180);
            pwVar6 = local_a8;
            pwVar15 = local_c0;
            pwVar5 = local_c8;
            pwVar4 = local_d0;
            pwVar3 = local_d8;
            pwVar17 = local_e0;
            pwVar22 = local_e8;
            pwVar19 = local_148;
            switch(uVar10) {
            case 0:
              uVar7 = 0xfffffffe;
              if ((wally_map_item *)local_e8->redeem_script == (wally_map_item *)0x0) {
                subfield_nomore_end(&local_178,&local_138,(uchar *)local_188,(size_t)local_180);
                sVar11 = pull_varlength(&local_178,&local_138);
                puVar13 = pull_skip(&local_178,&local_138,sVar11);
                if (sVar11 == 0) break;
                pwVar17 = local_130;
                pwVar19 = local_e8;
                if ((sVar11 != 0x21) != (puVar13 != (uchar *)0x0)) goto LAB_0016ff29;
              }
              goto LAB_0016ed8b;
            case 1:
              uVar7 = 0xfffffffe;
              if ((wally_map_item *)local_e0->redeem_script != (wally_map_item *)0x0)
              goto LAB_0016ed8b;
              subfield_nomore_end(&local_178,&local_138,(uchar *)local_188,(size_t)local_180);
              sVar11 = pull_varlength(&local_178,&local_138);
              puVar13 = pull_skip(&local_178,&local_138,sVar11);
              pwVar22 = pwVar17;
              if (sVar11 != 0) {
                pwVar17 = local_128;
                pwVar19 = local_e0;
                if ((sVar11 != 0x20) != (puVar13 != (uchar *)0x0)) goto LAB_0016ff29;
                goto LAB_0016ed8b;
              }
              break;
            case 2:
              uVar7 = 0xfffffffe;
              if ((wally_map_item *)local_d8->redeem_script != (wally_map_item *)0x0)
              goto LAB_0016ed8b;
              subfield_nomore_end(&local_178,&local_138,(uchar *)local_188,(size_t)local_180);
              sVar11 = pull_varlength(&local_178,&local_138);
              puVar13 = pull_skip(&local_178,&local_138,sVar11);
              pwVar22 = pwVar3;
              if (sVar11 != 0) {
                pwVar17 = local_120;
                pwVar19 = local_d8;
                if ((sVar11 != 0x21) != (puVar13 != (uchar *)0x0)) goto LAB_0016ff29;
                goto LAB_0016ed8b;
              }
              break;
            case 3:
              uVar7 = 0xfffffffe;
              if ((wally_map_item *)local_d0->redeem_script != (wally_map_item *)0x0)
              goto LAB_0016ed8b;
              subfield_nomore_end(&local_178,&local_138,(uchar *)local_188,(size_t)local_180);
              sVar11 = pull_varlength(&local_178,&local_138);
              puVar13 = pull_skip(&local_178,&local_138,sVar11);
              pwVar22 = pwVar4;
              if (sVar11 != 0) {
                pwVar17 = local_118;
                pwVar19 = local_d0;
                if ((sVar11 != 0x20) != (puVar13 != (uchar *)0x0)) goto LAB_0016ff29;
                goto LAB_0016ed8b;
              }
              break;
            case 4:
              if ((wally_map_item *)local_c0->redeem_script == (wally_map_item *)0x0) {
                subfield_nomore_end(&local_178,&local_138,(uchar *)local_188,(size_t)local_180);
                sVar11 = pull_varlength(&local_178,&local_138);
                puVar13 = pull_skip(&local_178,&local_138,sVar11);
                pwVar19 = local_c0;
                pwVar17 = local_108;
                goto joined_r0x0016ff12;
              }
              goto LAB_0016ed46;
            case 5:
              if ((wally_map_item *)local_148->redeem_script != (wally_map_item *)0x0)
              goto LAB_0016ed46;
              subfield_nomore_end(&local_178,&local_138,(uchar *)local_188,(size_t)local_180);
              sVar11 = pull_varlength(&local_178,&local_138);
              puVar13 = pull_skip(&local_178,&local_138,sVar11);
              pwVar15 = pwVar19;
              pwVar19 = local_148;
              pwVar17 = local_b0;
              goto joined_r0x0016ff12;
            case 6:
              if ((wally_map_item *)local_a8->redeem_script != (wally_map_item *)0x0)
              goto LAB_0016ed46;
              subfield_nomore_end(&local_178,&local_138,(uchar *)local_188,(size_t)local_180);
              sVar11 = pull_varlength(&local_178,&local_138);
              puVar13 = pull_skip(&local_178,&local_138,sVar11);
              pwVar22 = pwVar6;
              if (sVar11 != 0) {
                uVar7 = wally_psbt_output_set_blinding_pubkey(pwVar18,puVar13,sVar11);
                goto joined_r0x0016ff5c;
              }
              break;
            case 7:
              uVar7 = 0xfffffffe;
              if ((wally_map_item *)local_c8->redeem_script != (wally_map_item *)0x0)
              goto LAB_0016ed8b;
              subfield_nomore_end(&local_178,&local_138,(uchar *)local_188,(size_t)local_180);
              sVar11 = pull_varlength(&local_178,&local_138);
              puVar13 = pull_skip(&local_178,&local_138,sVar11);
              pwVar22 = pwVar5;
              if (sVar11 != 0) {
                pwVar17 = local_110;
                pwVar19 = local_c8;
                if ((sVar11 != 0x21) != (puVar13 != (uchar *)0x0)) goto LAB_0016ff29;
                goto LAB_0016ed8b;
              }
              break;
            default:
              goto switchD_0016ff9f_default;
            }
LAB_00170358:
            pwVar14 = (wally_map_item *)wally_malloc(1);
            pwVar22->redeem_script = (uchar *)pwVar14;
LAB_0017036b:
            puVar13 = local_178;
            local_180 = (uchar *)pull_varlength(&local_178,&local_138);
            if (local_180 == (uchar *)0x0) goto LAB_00170389;
            goto LAB_0016fdd6;
          }
LAB_00170389:
          pwVar15 = (wally_psbt_output *)((long)&local_100->redeem_script + 1);
        } while (pwVar15 < (wally_psbt_output *)local_160->tx->num_outputs);
      }
      uVar7 = 0xfffffffe;
      if (local_178 != (uchar *)0x0) {
        *local_68 = local_160;
        return 0;
      }
      goto LAB_0016ed8b;
    }
  }
LAB_0016ed46:
  uVar7 = 0xfffffffe;
LAB_0016ed8b:
  wally_psbt_free(local_160);
  return uVar7;
LAB_0016fc60:
  pwVar15 = (wally_psbt_output *)((long)&local_c8->redeem_script + 1);
  pwVar16 = local_160->tx;
  if ((wally_psbt_output *)pwVar16->num_inputs <= pwVar15) goto LAB_0016fc7e;
  goto LAB_0016f012;
}

Assistant:

int wally_psbt_from_bytes(const unsigned char *bytes, size_t len,
                          struct wally_psbt **output)
{
    const unsigned char *magic, *pre_key;
    int ret;
    size_t i, key_len;
    struct wally_psbt *result = NULL;
    uint32_t flags = 0, pre144flag = WALLY_TX_FLAG_PRE_BIP144;

    TX_CHECK_OUTPUT;

    magic = pull_skip(&bytes, &len, sizeof(PSBT_MAGIC));
    if (!magic) {
        ret = WALLY_EINVAL;  /* Not enough bytes */
        goto fail;
    }
    if (memcmp(magic, PSBT_MAGIC, sizeof(PSBT_MAGIC)) != 0 ) {
#ifdef BUILD_ELEMENTS
        if (memcmp(magic, PSET_MAGIC, sizeof(PSET_MAGIC)) != 0) {
            ret = WALLY_EINVAL;  /* Invalid Magic */
            goto fail;
        }
        flags |= WALLY_TX_FLAG_USE_ELEMENTS;
        pre144flag = 0;
#else
        ret = WALLY_EINVAL;  /* Invalid Magic */
        goto fail;
#endif /* BUILD_ELEMENTS */
    }

    /* Make the wally_psbt */
    if ((ret = wally_psbt_init_alloc(0, 0, 0, 8, &result)) != WALLY_OK)
        goto fail;

    /* Set the magic */
    memcpy(result->magic, magic, sizeof(PSBT_MAGIC));

    /* Read globals first */
    pre_key = bytes;
    while ((key_len = pull_varlength(&bytes, &len)) != 0) {
        const unsigned char *key, *val;
        size_t val_max;

        /* Start parsing key */
        pull_subfield_start(&bytes, &len, key_len, &key, &key_len);

        /* Process based on type */
        switch (pull_varint(&key, &key_len)) {
        case PSBT_GLOBAL_UNSIGNED_TX: {
            struct wally_tx *tx;

            subfield_nomore_end(&bytes, &len, key, key_len);

            /* Start parsing the value field. */
            pull_subfield_start(&bytes, &len,
                                pull_varint(&bytes, &len),
                                &val, &val_max);
            ret = wally_tx_from_bytes(val, val_max, flags | pre144flag, &tx);
            if (ret == WALLY_OK) {
                ret = psbt_set_global_tx(result, tx, false);
                if (ret != WALLY_OK)
                    wally_tx_free(tx);
            }
            if (ret != WALLY_OK)
                goto fail;
            pull_subfield_end(&bytes, &len, val, val_max);
            break;
        }
        case PSBT_GLOBAL_VERSION: {
            if (result->version > 0) {
                ret = WALLY_EINVAL;    /* Version already provided */
                goto fail;
            }
            subfield_nomore_end(&bytes, &len, key, key_len);

            /* Start parsing the value field. */
            pull_subfield_start(&bytes, &len,
                                pull_varint(&bytes, &len),
                                &val, &val_max);
            result->version = pull_le32(&val, &val_max);
            subfield_nomore_end(&bytes, &len, val, val_max);
            if (result->version > WALLY_PSBT_HIGHEST_VERSION) {
                ret = WALLY_EINVAL;    /* Unsupported version number */
                goto fail;
            }
            break;
        }
        /* Unknowns */
        default: {
            ret = pull_unknown_key_value(&bytes, &len, pre_key, &result->unknowns);
            if (ret != WALLY_OK)
                goto fail;
            break;
        }
        }
        pre_key = bytes;
    }

    /* We don't technically need to test here, but it's a minor optimization */
    if (!bytes) {
        ret = WALLY_EINVAL; /* Missing global separator */
        goto fail;
    }

    if (!result->tx) {
        ret = WALLY_EINVAL; /* No global tx */
        goto fail;
    }

    /* Read inputs */
    for (i = 0; i < result->tx->num_inputs; ++i) {
        ret = pull_psbt_input(&bytes, &len, flags, &result->inputs[i]);
        if (ret != WALLY_OK)
            goto fail;
    }

    /* Read outputs */
    for (i = 0; i < result->tx->num_outputs; ++i) {
        ret = pull_psbt_output(&bytes, &len, &result->outputs[i]);
        if (ret != WALLY_OK)
            goto fail;
    }

    /* If we ran out of data anywhere, fail. */
    if (!bytes) {
        ret = WALLY_EINVAL;
        goto fail;
    }

    *output = result;
    return WALLY_OK;

fail:
    wally_psbt_free(result);
    return ret;
}